

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall
edition_unittest::TestNestedMessageHasBits_NestedMessage::ByteSizeLong
          (TestNestedMessageHasBits_NestedMessage *this)

{
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_00;
  size_t sVar1;
  void **ppvVar2;
  const_iterator cVar3;
  size_t sVar4;
  
  sVar1 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.nestedmessage_repeated_int32_,1,
                     &(this->field_0)._impl_._nestedmessage_repeated_int32_cached_byte_size_);
  sVar1 = (long)*(int *)((long)&this->field_0 + 0x20) + sVar1;
  this_00 = &(this->field_0)._impl_.nestedmessage_repeated_foreignmessage_;
  ppvVar2 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar3 = google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::end(this_00);
  for (; ppvVar2 != cVar3.it_; ppvVar2 = ppvVar2 + 1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<edition_unittest::ForeignMessage>((ForeignMessage *)*ppvVar2);
    sVar1 = sVar1 + sVar4;
  }
  sVar1 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar1,&(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t TestNestedMessageHasBits_NestedMessage::ByteSizeLong() const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 nestedmessage_repeated_int32 = 1;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_nestedmessage_repeated_int32(), 1,
              this_._impl_._nestedmessage_repeated_int32_cached_byte_size_);
    }
    // repeated .edition_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
    {
      total_size += 1UL * this_._internal_nestedmessage_repeated_foreignmessage_size();
      for (const auto& msg : this_._internal_nestedmessage_repeated_foreignmessage()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}